

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zhash.c
# Opt level: O2

int zhash_uint64_equals(void *_a,void *_b)

{
  if (_a == (void *)0x0) {
    __assert_fail("_a != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/zhash.c"
                  ,0x1e2,"int zhash_uint64_equals(const void *, const void *)");
  }
  if (_b != (void *)0x0) {
    return (int)(*_a == *_b);
  }
  __assert_fail("_b != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/zhash.c"
                ,0x1e3,"int zhash_uint64_equals(const void *, const void *)");
}

Assistant:

int zhash_uint64_equals(const void *_a, const void *_b)
{
    assert(_a != NULL);
    assert(_b != NULL);

    uint64_t a = *((uint64_t*) _a);
    uint64_t b = *((uint64_t*) _b);

    return a==b;
}